

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::NinjaCmd_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  pointer pcVar2;
  allocator<char> local_31;
  string_view local_30;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *local_20;
  value_type *lgen;
  cmGlobalNinjaGenerator *this_local;
  
  lgen = (value_type *)this;
  this_local = (cmGlobalNinjaGenerator *)__return_storage_ptr__;
  local_20 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                           LocalGenerators,0);
  bVar1 = std::operator!=(local_20,(nullptr_t)0x0);
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (local_20);
    local_30 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)&this->NinjaCommand);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (__return_storage_ptr__,&pcVar2->super_cmOutputConverter,local_30,SHELL);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ninja",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::NinjaCmd() const
{
  const auto& lgen = this->LocalGenerators[0];
  if (lgen != nullptr) {
    return lgen->ConvertToOutputFormat(this->NinjaCommand,
                                       cmOutputConverter::SHELL);
  }
  return "ninja";
}